

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_has_encrypted_entries(archive *_a)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  
  iVar1 = -2;
  if (((_a != (archive *)0x0) && (_a[0x15].archive_format_name != (char *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(_a[0x15].archive_format_name + 0x48),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    uVar2 = (*UNRECOVERED_JUMPTABLE)(_a);
    if ((uVar2 & 3) != 0) {
      iVar1 = -1;
      if ((_a[0x15].archive_format_name != (char *)0x0) &&
         (UNRECOVERED_JUMPTABLE = *(code **)(_a[0x15].archive_format_name + 0x50),
         UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        iVar1 = (*UNRECOVERED_JUMPTABLE)(_a);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int
archive_read_has_encrypted_entries(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int format_supports_encryption = archive_read_format_capabilities(_a)
			& (ARCHIVE_READ_FORMAT_CAPS_ENCRYPT_DATA | ARCHIVE_READ_FORMAT_CAPS_ENCRYPT_METADATA);

	if (!_a || !format_supports_encryption) {
		/* Format in general doesn't support encryption */
		return ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED;
	}

	/* A reader potentially has read enough data now. */
	if (a->format && a->format->has_encrypted_entries) {
		return (a->format->has_encrypted_entries)(a);
	}

	/* For any other reason we cannot say how many entries are there. */
	return ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;
}